

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O2

word256 * w256_from_bitstream(word256 *__return_storage_ptr__,bitstream_t *bs,size_t width,
                             size_t size)

{
  word256 *in_RAX;
  uint64_t uVar1;
  uint64_t *puVar2;
  uint64_t buf [4];
  uint64_t auStack_88 [12];
  
  puVar2 = auStack_88 + (long)bs;
  auStack_88[1] = 0;
  auStack_88[2] = 0;
  auStack_88[3] = 0;
  auStack_88[4] = 0;
  for (; 0x3f < width; width = width - 0x40) {
    auStack_88[0] = 0x108350;
    in_RAX = (word256 *)bitstream_get_bits((bitstream_t *)__return_storage_ptr__,0x40);
    *puVar2 = (uint64_t)in_RAX;
    puVar2 = puVar2 + -1;
  }
  if (width != 0) {
    auStack_88[0] = 0x108370;
    uVar1 = bitstream_get_bits((bitstream_t *)__return_storage_ptr__,(uint)width);
    in_RAX = (word256 *)(uVar1 << ((ulong)(byte)-(char)width & 0x3f));
    *puVar2 = (uint64_t)in_RAX;
  }
  return in_RAX;
}

Assistant:

ATTR_TARGET_S256
static inline word256 w256_from_bitstream(bitstream_t* bs, const size_t width, const size_t size) {
  ATTR_ALIGNED(32) uint64_t buf[4] = {0};
  uint64_t* d                      = &buf[width - 1];
  size_t bits                      = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    *d = bitstream_get_bits(bs, sizeof(uint64_t) * 8);
  }
  if (bits) {
    *d = bitstream_get_bits(bs, bits) << (sizeof(uint64_t) * 8 - bits);
  }

  return mm256_load(&buf[0]);
}